

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpc_and(int n,mpc_fold_t f,...)

{
  char in_AL;
  mpc_parser_t *pmVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x18';
  (pmVar1->data).repeat.n = n;
  (pmVar1->data).repeat.f = f;
  pvVar2 = malloc((long)n * 8);
  (pmVar1->data).apply_to.d = pvVar2;
  pvVar3 = malloc((long)n * 8 - 8);
  (pmVar1->data).check_with.d = pvVar3;
  puVar6 = (undefined8 *)&stack0x00000008;
  uVar4 = 0x10;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < n) {
    uVar9 = (ulong)(uint)n;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    if (uVar4 < 0x29) {
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 8;
      puVar7 = (undefined8 *)((long)local_e8 + uVar5);
    }
    else {
      puVar7 = puVar6;
      puVar6 = puVar6 + 1;
    }
    *(undefined8 *)((long)pvVar2 + uVar8 * 8) = *puVar7;
  }
  uVar9 = 0;
  uVar8 = (ulong)(n - 1U);
  if ((int)(n - 1U) < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    if (uVar4 < 0x29) {
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 8;
      puVar7 = (undefined8 *)((long)local_e8 + uVar5);
    }
    else {
      puVar7 = puVar6;
      puVar6 = puVar6 + 1;
    }
    *(undefined8 *)((long)pvVar3 + uVar9 * 8) = *puVar7;
  }
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_and(int n, mpc_fold_t f, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_AND;
  p->data.and.n = n;
  p->data.and.f = f;
  p->data.and.xs = malloc(sizeof(mpc_parser_t*) * n);
  p->data.and.dxs = malloc(sizeof(mpc_dtor_t) * (n-1));

  va_start(va, f);
  for (i = 0; i < n; i++) {
    p->data.and.xs[i] = va_arg(va, mpc_parser_t*);
  }
  for (i = 0; i < (n-1); i++) {
    p->data.and.dxs[i] = va_arg(va, mpc_dtor_t);
  }
  va_end(va);

  return p;
}